

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe2_LPGCachePolicy.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmXe2_LPGCachePolicy::CachePolicyGetPATIndex
          (GmmXe2_LPGCachePolicy *this,GMM_RESOURCE_INFO *pResInfo,GMM_RESOURCE_USAGE_TYPE Usage,
          bool *pCompressionEnable,bool IsCpuCacheable)

{
  uint uVar1;
  byte local_18d;
  uint local_18c;
  uint local_180;
  bool local_165;
  uint local_164;
  undefined1 local_160 [3];
  bool CompressionEnable;
  uint32_t ReturnPATIndex;
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 local_158;
  uint local_134;
  undefined1 local_130 [4];
  uint32_t PATIndexCompressed;
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 local_128;
  GMM_CACHE_POLICY_ELEMENT local_108;
  uint local_dc;
  undefined1 local_d8 [4];
  uint32_t CoherentPATIndex;
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 local_d0;
  GMM_CACHE_POLICY_ELEMENT local_b0;
  uint local_84;
  undefined1 local_80 [4];
  uint32_t TempCoherentPATIndex;
  GMM_CACHE_POLICY_ELEMENT TempElement;
  uint local_44;
  uint32_t PATIndex;
  bool IsCpuCacheable_local;
  bool *pCompressionEnable_local;
  GMM_RESOURCE_USAGE_TYPE Usage_local;
  GMM_RESOURCE_INFO *pResInfo_local;
  GmmXe2_LPGCachePolicy *this_local;
  
  Context::GetCachePolicyElement
            ((GMM_CACHE_POLICY_ELEMENT *)&TempElement.Override,
             (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
             super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
             super_GmmCachePolicyCommon.pGmmLibContext,Usage);
  Context::GetCachePolicyElement
            ((GMM_CACHE_POLICY_ELEMENT *)local_80,
             (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
             super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
             super_GmmCachePolicyCommon.pGmmLibContext,Usage);
  local_84 = 0;
  TempElement._0_8_ =
       TempElement._0_8_ & 0xffff03ffffffffff |
       ((long)(int)((TempElement._4_4_ >> 10 & 0x3f) + 1) & 0x3fU) << 0x2a;
  Context::GetCachePolicyElement
            (&local_b0,
             (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
             super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
             super_GmmCachePolicyCommon.pGmmLibContext,Usage);
  Context::GetCachePolicyElement
            ((GMM_CACHE_POLICY_ELEMENT *)local_d8,
             (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
             super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
             super_GmmCachePolicyCommon.pGmmLibContext,Usage);
  uVar1 = (uint)((local_b0.field_1.Value >> 0x29 & 1) << 5);
  local_84 = uVar1 | (uint)local_d0.Value._4_4_ >> 4 & 0x1f;
  if (uVar1 == 0x20) {
    local_180 = 0xffffffff;
  }
  else {
    Context::GetCachePolicyElement
              (&local_108,
               (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext,Usage);
    Context::GetCachePolicyElement
              ((GMM_CACHE_POLICY_ELEMENT *)local_130,
               (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext,Usage);
    local_180 = (uint)((local_108.field_1.Value >> 0x29 & 1) << 5) |
                (uint)local_128.Value._4_4_ >> 4 & 0x1f;
  }
  local_dc = local_180;
  if (((ulong)TempElement._0_8_ >> 0x2a & 0x3f) == 0) {
    local_18c = 0xffffffff;
  }
  else {
    Context::GetCachePolicyElement
              ((GMM_CACHE_POLICY_ELEMENT *)local_160,
               (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pGmmLibContext,Usage);
    local_18c = (uint)local_158.Value._4_4_ >> 10 & 0x3f;
  }
  local_134 = local_18c;
  local_164 = 0xffffffff;
  if (pCompressionEnable == (bool *)0x0) {
    local_18d = 0;
  }
  else {
    local_18d = *pCompressionEnable;
  }
  if (pResInfo != (GMM_RESOURCE_INFO *)0x0) {
    (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
  }
  if ((local_18d & 1) == 0) {
    if (local_44 != 0xffffffff) {
      local_164 = local_44;
    }
    local_165 = false;
  }
  else {
    if (local_134 == 0xffffffff) {
      local_164 = local_44;
    }
    else {
      local_164 = local_134;
    }
    local_165 = local_134 != 0xffffffff;
  }
  if (local_164 == 0xffffffff) {
    local_164 = 2;
    local_165 = false;
  }
  if (pCompressionEnable != (bool *)0x0) {
    *pCompressionEnable = local_165;
  }
  return local_164;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmXe2_LPGCachePolicy::CachePolicyGetPATIndex(GMM_RESOURCE_INFO *pResInfo, GMM_RESOURCE_USAGE_TYPE Usage, bool *pCompressionEnable, bool IsCpuCacheable)
{
    __GMM_ASSERT(pGmmLibContext->GetCachePolicyElement(Usage).Initialized);

    uint32_t                 PATIndex             = pGmmLibContext->GetCachePolicyElement(Usage).PATIndex;
    GMM_CACHE_POLICY_ELEMENT TempElement          = pGmmLibContext->GetCachePolicyElement(Usage);
    uint32_t                 TempCoherentPATIndex = 0;

    // This is to check if PATIndexCompressed, CoherentPATIndex are valid
    // Increment by 1 to have the rollover and value resets to 0 if the PAT in not valid.
    TempElement.PATIndexCompressed += 1;
    TempCoherentPATIndex = (uint32_t)GET_COHERENT_PATINDEX_VALUE(pGmmLibContext, Usage);

    // Higher bit of CoherentPATIndex would tell us if its a valid or not.0--> valid, 1-->invalid
    uint32_t CoherentPATIndex = (uint32_t)((GET_COHERENT_PATINDEX_HIGHER_BIT(TempCoherentPATIndex) == 1) ? GMM_PAT_ERROR : GET_COHERENT_PATINDEX_VALUE(pGmmLibContext, Usage));
    //For PATIndexCompressed, rollover value would be 0 if its invalid
    uint32_t PATIndexCompressed = (uint32_t)(TempElement.PATIndexCompressed == 0 ? GMM_PAT_ERROR : pGmmLibContext->GetCachePolicyElement(Usage).PATIndexCompressed);
    uint32_t ReturnPATIndex     = GMM_PAT_ERROR;
    bool     CompressionEnable  = (pCompressionEnable) ? *pCompressionEnable : false;

    // Prevent wrong Usage for XAdapter resources. UMD does not call GetMemoryObject on shader resources but,
    // when they add it someone could call it without knowing the restriction.
    if (pResInfo &&
        pResInfo->GetResFlags().Info.XAdapter &&
        (Usage != GMM_RESOURCE_USAGE_XADAPTER_SHARED_RESOURCE))
    {
        __GMM_ASSERT(false);
    }

#if (defined __linux__ || defined(WDDM_LINUX))
    IsCpuCacheable = false;
#endif
    // requested compressed and coherent
    if (CompressionEnable && IsCpuCacheable)
    {
        // return coherent uncompressed
        ReturnPATIndex    = CoherentPATIndex;
        CompressionEnable = false;
        GMM_ASSERTDPF(false, "Coherent Compressed is not supported on Xe2. However, respecting the coherency and returning CoherentPATIndex");
    }
    // requested compressed only
    else if (CompressionEnable)
    {

        if (GMM_PAT_ERROR != PATIndexCompressed)
        {
            // return compresed, may or may not coherent which depends on orinigal usage
            ReturnPATIndex    = PATIndexCompressed;
            CompressionEnable = true;
        }
        else
        {
            // return original index
            ReturnPATIndex    = PATIndex;
            CompressionEnable = false;
        }
    }
    // requested coherent only
    else if (IsCpuCacheable)
    {
        //return coherent uncompressed
        ReturnPATIndex    = CoherentPATIndex;
        CompressionEnable = false;
    }
    /* Requested UnCompressed PAT */
    else
    {
        if (GMM_PAT_ERROR != PATIndex)
        {
            ReturnPATIndex    = PATIndex;
            CompressionEnable = false;
        }
    }

    /* No valid PAT Index found */
    if (GMM_PAT_ERROR == ReturnPATIndex)
    {
        ReturnPATIndex    = GMM_XE2_DEFAULT_PAT_INDEX; //default to uncached PAT index 2: GMM_CP_NON_COHERENT_UC
        CompressionEnable = false;
        __GMM_ASSERT(false);
    }

    if (pCompressionEnable)
    {
        *pCompressionEnable = CompressionEnable;
    }

    return ReturnPATIndex;
}